

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

Nonnull<CordRep_*>
absl::lts_20250127::cord_internal::NewExternalRep<absl::lts_20250127::Cord::FlattenSlowPath()::__0>
          (string_view data,type *releaser)

{
  bool bVar1;
  Nonnull<CordRep_*> this;
  Nonnull<CordRepExternal_*> in_RCX;
  string_view data_00;
  CordRepExternal *rep;
  type *releaser_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  releaser_local = (type *)data._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&releaser_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!data.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                  ,0x46e,
                  "absl::Nonnull<CordRep *> absl::cord_internal::NewExternalRep(absl::string_view, Releaser &&) [Releaser = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc:1389:52)]"
                 );
  }
  this = (Nonnull<CordRep_*>)operator_new(0x20);
  CordRepExternalImpl<absl::lts_20250127::Cord::FlattenSlowPath()::$_0>::
  CordRepExternalImpl<absl::lts_20250127::Cord::FlattenSlowPath()::__0>
            ((CordRepExternalImpl<absl::lts_20250127::Cord::FlattenSlowPath()::__0> *)this,releaser,
             0);
  data_00._M_str = (char *)this;
  data_00._M_len = data_local._M_len;
  InitializeCordRepExternal((cord_internal *)releaser_local,data_00,in_RCX);
  return this;
}

Assistant:

absl::Nonnull<CordRep*> NewExternalRep(absl::string_view data,
                                       Releaser&& releaser) {
  assert(!data.empty());
  using ReleaserType = absl::decay_t<Releaser>;
  CordRepExternal* rep = new CordRepExternalImpl<ReleaserType>(
      std::forward<Releaser>(releaser), 0);
  InitializeCordRepExternal(data, rep);
  return rep;
}